

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O2

int __thiscall QMetaObjectBuilder::indexOfSlot(QMetaObjectBuilder *this,QByteArray *signature)

{
  pointer pQVar1;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  char *method;
  pointer rhs;
  long lVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = &DAT_aaaaaaaaaaaaaaaa;
  method = (signature->d).ptr;
  if (method == (char *)0x0) {
    method = &QByteArray::_empty;
  }
  QMetaObject::normalizedSignature((QByteArray *)&local_58,method);
  rhs = (this->d->methods).
        super__Vector_base<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>.
        _M_impl.super__Vector_impl_data._M_start;
  pQVar1 = (this->d->methods).
           super__Vector_base<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = -(long)rhs;
  iVar3 = -1;
  do {
    if (rhs == pQVar1) {
LAB_00268679:
      QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return iVar3;
      }
      __stack_chk_fail();
    }
    if ((rhs->attributes & 0xcU) == 8) {
      bVar2 = ::operator==((QByteArray *)&local_58,&rhs->signature);
      if (bVar2) {
        pvVar4 = std::vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>
                 ::front(&this->d->methods);
        iVar3 = (int)(-((long)&(pvVar4->signature).d.d + lVar5) / 0x68);
        goto LAB_00268679;
      }
    }
    rhs = rhs + 1;
    lVar5 = lVar5 + -0x68;
  } while( true );
}

Assistant:

int QMetaObjectBuilder::indexOfSlot(const QByteArray &signature)
{
    QByteArray sig = QMetaObject::normalizedSignature(signature);
    for (const auto &method : d->methods) {
        if (method.methodType() == QMetaMethod::Slot && sig == method.signature)
            return int(&method - &d->methods.front());
    }
    return -1;
}